

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

void vkt::pipeline::multisample::uploadVertexDataNdcScreen
               (Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton,
               Vec2 *screenSize)

{
  void *dst;
  VertexDataNdcScreen *src;
  float fVar1;
  float y_;
  Vector<float,_2> local_104;
  Vector<float,_4> local_fc;
  VertexDataNdcScreen local_ec;
  Vector<float,_2> local_d4;
  Vector<float,_4> local_cc;
  VertexDataNdcScreen local_bc;
  Vector<float,_2> local_a4;
  Vector<float,_4> local_9c;
  VertexDataNdcScreen local_8c;
  Vector<float,_2> local_74 [2];
  Vector<float,_4> local_60;
  VertexDataNdcScreen local_50;
  undefined1 local_38 [8];
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  vertices;
  Vec2 *screenSize_local;
  VertexDataDesc *vertexDataDescripton_local;
  Allocation *vertexBufferAllocation_local;
  
  vertices.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)screenSize;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::vector((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
            *)local_38);
  tcu::Vector<float,_4>::Vector(&local_60,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_2>::Vector(local_74,0.0,0.0);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_50,&local_60,local_74);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_38,&local_50);
  tcu::Vector<float,_4>::Vector(&local_9c,1.0,-1.0,0.0,1.0);
  fVar1 = tcu::Vector<float,_2>::x
                    ((Vector<float,_2> *)
                     vertices.
                     super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Vector<float,_2>::Vector(&local_a4,fVar1,0.0);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_8c,&local_9c,&local_a4);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_38,&local_8c);
  tcu::Vector<float,_4>::Vector(&local_cc,-1.0,1.0,0.0,1.0);
  fVar1 = tcu::Vector<float,_2>::y
                    ((Vector<float,_2> *)
                     vertices.
                     super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Vector<float,_2>::Vector(&local_d4,0.0,fVar1);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_bc,&local_cc,&local_d4);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_38,&local_bc);
  tcu::Vector<float,_4>::Vector(&local_fc,1.0,1.0,0.0,1.0);
  fVar1 = tcu::Vector<float,_2>::x
                    ((Vector<float,_2> *)
                     vertices.
                     super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  y_ = tcu::Vector<float,_2>::y
                 ((Vector<float,_2> *)
                  vertices.
                  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Vector<float,_2>::Vector(&local_104,fVar1,y_);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_ec,&local_fc,&local_104);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_38,&local_ec);
  dst = ::vk::Allocation::getHostPtr(vertexBufferAllocation);
  src = dataPointer<vkt::pipeline::multisample::VertexDataNdcScreen>
                  ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                    *)local_38);
  ::deMemcpy(dst,src,vertexDataDescripton->dataSize);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::~vector((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
             *)local_38);
  return;
}

Assistant:

void uploadVertexDataNdcScreen (const Allocation& vertexBufferAllocation, const MultisampleInstanceBase::VertexDataDesc& vertexDataDescripton, const tcu::Vec2& screenSize)
{
	std::vector<VertexDataNdcScreen> vertices;

	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, screenSize.y())));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), screenSize.y())));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}